

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialVector * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator*
          (SpatialRigidBodyInertia *this,SpatialVector *mv)

{
  double dVar1;
  CoeffReturnType pdVar2;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  SpatialVector *in_RDI;
  double *v2;
  double *v3;
  Vector3d res_lower;
  Vector3d res_upper;
  Vector3d mv_lower;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffdb8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffdc0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  double *in_stack_fffffffffffffdf8;
  double *in_stack_fffffffffffffe00;
  StorageBaseType *matrix;
  double *in_stack_fffffffffffffe08;
  double *v0;
  Vector3_t *in_stack_fffffffffffffe10;
  Vector3_t *this_02;
  double *v4;
  double *v2_00;
  double *v1;
  double *v0_00;
  SpatialVector_t *this_03;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe58;
  
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  other = *(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> **)(in_RSI + 0x20);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  this_01 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pdVar2;
  dVar1 = *(double *)(in_RSI + 0x28);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  v2 = (double *)((double)other * (double)this_01 + dVar1 * *pdVar2);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  v0 = *(double **)(in_RSI + 0x28);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  this_02 = (Vector3_t *)*pdVar2;
  matrix = *(StorageBaseType **)(in_RSI + 0x30);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  v3 = (double *)((double)v0 * (double)this_02 + (double)matrix * *pdVar2);
  v4 = *(double **)(in_RSI + 0x40);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  v1 = *(double **)(in_RSI + 0x38);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  v0_00 = (double *)*pdVar2;
  v2_00 = *(double **)(in_RSI + 0x40);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  this_03 = *(SpatialVector_t **)(in_RSI + 0x48);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  Vector3_t::Vector3_t(this_02,v0,(double *)matrix,v2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffe58,in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+(this_01,other);
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Vector3_t *)in_stack_fffffffffffffdc0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffdb8);
  Eigen::operator*(v0,matrix);
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                       in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffdc0,
             (Index)in_stack_fffffffffffffdb8);
  Vector3_t::Vector3_t(this_02,v0,(double *)matrix,v2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (this_00,in_RSI);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)this_01,other);
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Vector3_t *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffdc0,(Index)in_stack_fffffffffffffdb8);
  SpatialVector_t::SpatialVector_t(this_03,v0_00,v1,v2_00,v3,v4,(double *)in_RSI);
  return in_RDI;
}

Assistant:

SpatialVector operator* (const SpatialVector &mv) {
    Vector3d mv_lower (mv[3], mv[4], mv[5]);

    Vector3d res_upper = Vector3d (
        Ixx * mv[0] + Iyx * mv[1] + Izx * mv[2],
        Iyx * mv[0] + Iyy * mv[1] + Izy * mv[2],
        Izx * mv[0] + Izy * mv[1] + Izz * mv[2]
        ) + h.cross(mv_lower);
    Vector3d res_lower = m * mv_lower - h.cross (Vector3d (mv[0], mv[1], mv[2]));

    return SpatialVector (
        res_upper[0], res_upper[1], res_upper[2],
        res_lower[0], res_lower[1], res_lower[2]
        );
  }